

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::
SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
::clear(SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
        *this)

{
  unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  *puVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  __ptr;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (this->
          super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
          ).buffer_size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      puVar1 = (this->
               super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
               ).ptr;
      __ptr.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl =
           puVar1[uVar3]._M_t.
           super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
           .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>;
      if (__ptr.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl !=
          (SPIRBlock *)0x0) {
        free((void *)__ptr.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl);
        uVar2 = (this->
                super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                ).buffer_size;
      }
      puVar1[uVar3]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> =
           (_Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>)0x0;
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  (this->
  super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
  ).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}